

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
TryEmplace<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
::TestBody(TryEmplace<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_5a0;
  AssertHelper local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_590;
  undefined1 local_588 [8];
  _Alloc_hider _Stack_580;
  undefined1 local_578 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_570;
  AssertHelper local_550;
  Message local_548;
  undefined1 local_540 [8];
  _Head_base<0UL,_unsigned_long,_false> local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  pair<const_int,_phmap::priv::NonStandardLayout> local_518;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  local_4e8;
  long lStack_4b0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_4a8;
  
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_518,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)&local_4a8);
  lVar3 = 0x40;
  do {
    *(undefined8 *)((long)&local_4e8.first.it_.ctrl_ + lVar3) = 0;
    *(undefined8 *)((long)&local_4e8.first.it_.field_1 + lVar3) = 0;
    *(undefined8 *)((long)&local_4e8.first.inner_ + lVar3) = 0;
    *(undefined8 *)((long)&local_4e8.first.inner_end_ + lVar3) = 0;
    *(undefined8 *)((long)&local_4e8.first.it_end_.field_1 + lVar3) = 0;
    *(long *)(&local_4e8.second + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&lStack_4b0 + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4a8.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x4c0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_518.first;
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::try_emplace_impl_with_hash<int_const&,phmap::priv::NonStandardLayout&>
            (&local_4e8,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_4a8,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_518.first,&local_518.second);
  local_548.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_548.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_4e8.second);
  local_540 = (undefined1  [8])0x0;
  if (local_4e8.second == false) {
    testing::Message::Message((Message *)&local_598);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_588,(internal *)&local_548,(AssertionResult *)"p.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xa7,(char *)local_588);
    testing::internal::AssertHelper::operator=(&local_5a0,(Message *)&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    if (local_588 != (undefined1  [8])local_578) {
      operator_delete((void *)local_588,(ulong)((long)local_578 + 1));
    }
    if ((long *)CONCAT71(local_598.data_._1_7_,local_598.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_598.data_._1_7_,local_598.data_._0_1_) + 8))();
    }
  }
  if (local_540 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_540,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540);
  }
  testing::internal::
  CmpHelperEQ<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((internal *)local_588,"val","*p.first",&local_518,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_4e8.first.it_.field_1.slot_);
  if (local_588[0] == (internal)0x0) {
    testing::Message::Message(&local_548);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_580._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)_Stack_580._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xa8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_598,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    if ((long *)CONCAT44(local_548.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_548.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_548.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_548.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_580._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_580,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_580._M_p);
  }
  hash_internal::Generator<phmap::priv::NonStandardLayout,_void>::operator()
            ((NonStandardLayout *)local_588,
             (Generator<phmap::priv::NonStandardLayout,_void> *)&local_598);
  local_548.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_518.first;
  local_540 = (undefined1  [8])&PTR__NonStandardLayout_0034a128;
  local_538._M_head_impl = (unsigned_long)&local_528;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_538,_Stack_580._M_p,_Stack_580._M_p + (long)local_578);
  local_588 = (undefined1  [8])&PTR__NonStandardLayout_0034a128;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_580._M_p !=
      &bStack_570) {
    operator_delete(_Stack_580._M_p,(ulong)((long)bStack_570._M_dataplus._M_p + 1));
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)local_548.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::try_emplace_impl_with_hash<int_const&,phmap::priv::NonStandardLayout&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
              *)local_588,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_4a8,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),(int *)&local_548,
             (NonStandardLayout *)local_540);
  local_4e8.first.it_end_.ctrl_ = (ctrl_t *)bStack_570._M_string_length;
  local_4e8.first.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)bStack_570.field_2._M_allocated_capacity;
  local_4e8.first.it_.ctrl_ = (ctrl_t *)local_578;
  local_4e8.first.it_.field_1.slot_ = (slot_type *)bStack_570._M_dataplus._M_p;
  local_4e8.first.inner_ = (Inner *)local_588;
  local_4e8.first.inner_end_ = (Inner *)_Stack_580._M_p;
  local_4e8.second = (bool)bStack_570.field_2._M_local_buf[8];
  local_598.data_._0_1_ =
       (Generator<phmap::priv::NonStandardLayout,_void>)(bStack_570.field_2._M_local_buf[8] ^ 1);
  local_590 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bStack_570.field_2._M_local_buf[8] != 0) {
    testing::Message::Message((Message *)&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_588,(internal *)&local_598,(AssertionResult *)"p.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xab,(char *)local_588);
    testing::internal::AssertHelper::operator=(&local_550,(Message *)&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    if (local_588 != (undefined1  [8])local_578) {
      operator_delete((void *)local_588,(ulong)((long)local_578 + 1));
    }
    if (local_5a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_5a0.data_ + 8))();
    }
  }
  if (local_590 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_590,local_590);
  }
  testing::internal::
  CmpHelperEQ<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((internal *)local_588,"val","*p.first",&local_518,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_4e8.first.it_.field_1.slot_);
  if (local_588[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_598);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_580._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)_Stack_580._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0xac,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5a0,(Message *)&local_598);
    testing::internal::AssertHelper::~AssertHelper(&local_5a0);
    if ((long *)CONCAT71(local_598.data_._1_7_,local_598.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_598.data_._1_7_,local_598.data_._0_1_) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_580._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_580,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_580._M_p);
  }
  local_540 = (undefined1  [8])&PTR__NonStandardLayout_0034a128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_head_impl != &local_528) {
    operator_delete((void *)local_538._M_head_impl,local_528._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_4a8);
  local_518.second._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0034a128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518.second.value._M_dataplus._M_p != &local_518.second.value.field_2) {
    operator_delete(local_518.second.value._M_dataplus._M_p,
                    local_518.second.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, TryEmplace) {
#ifdef UNORDERED_MAP_CXX17
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto p = m.try_emplace(val.first, val.second);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.try_emplace(val2.first, val2.second);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
#endif
}